

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ParameterExpression::Copy(ParameterExpression *this)

{
  pointer pPVar1;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> local_20;
  
  make_uniq<duckdb::ParameterExpression>();
  pPVar1 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pPVar1->identifier);
  pPVar1 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_20);
  ParsedExpression::CopyProperties(&pPVar1->super_ParsedExpression,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ParameterExpression::Copy() const {
	auto copy = make_uniq<ParameterExpression>();
	copy->identifier = identifier;
	copy->CopyProperties(*this);
	return std::move(copy);
}